

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O3

FileList * __thiscall
ASDCP::DCData::FileList::operator=
          (FileList *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pathlist)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Node *p_Var3;
  
  for (p_Var2 = (pathlist->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)pathlist;
      p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var2 + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->
              super_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return this;
}

Assistant:

const FileList& operator=(const std::list<std::string>& pathlist) {
        std::list<std::string>::const_iterator i;
        for ( i = pathlist.begin(); i != pathlist.end(); i++ )
            push_back(*i);
        return *this;
    }